

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SField.cpp
# Opt level: O0

SField * jbcoin::SField::getField(string *fieldName)

{
  bool bVar1;
  __type _Var2;
  reference ppVar3;
  pointer pSVar4;
  pair<const_int,_std::unique_ptr<const_jbcoin::SField,_std::default_delete<const_jbcoin::SField>_>_>
  *fieldPair_1;
  iterator __end2;
  iterator __begin2;
  map<int,_std::unique_ptr<const_jbcoin::SField,_std::default_delete<const_jbcoin::SField>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::unique_ptr<const_jbcoin::SField,_std::default_delete<const_jbcoin::SField>_>_>_>_>
  *__range2;
  StaticScopedLockType sl;
  pair<const_int,_const_jbcoin::SField_*> *fieldPair;
  iterator __end1;
  iterator __begin1;
  map<int,_const_jbcoin::SField_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_jbcoin::SField_*>_>_>
  *__range1;
  string *fieldName_local;
  
  __end1 = std::
           map<int,_const_jbcoin::SField_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_jbcoin::SField_*>_>_>
           ::begin((map<int,_const_jbcoin::SField_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_jbcoin::SField_*>_>_>
                    *)knownCodeToField);
  fieldPair = (pair<const_int,_const_jbcoin::SField_*> *)
              std::
              map<int,_const_jbcoin::SField_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_jbcoin::SField_*>_>_>
              ::end((map<int,_const_jbcoin::SField_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_jbcoin::SField_*>_>_>
                     *)knownCodeToField);
  while (bVar1 = std::operator!=(&__end1,(_Self *)&fieldPair), bVar1) {
    sl._M_device = (mutex_type *)
                   std::_Rb_tree_iterator<std::pair<const_int,_const_jbcoin::SField_*>_>::operator*
                             (&__end1);
    _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &((reference)sl._M_device)->second->fieldName,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            fieldName);
    if (_Var2) {
      return *(SField **)((long)&((sl._M_device)->super___mutex_base)._M_mutex + 8);
    }
    std::_Rb_tree_iterator<std::pair<const_int,_const_jbcoin::SField_*>_>::operator++(&__end1);
  }
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)&__range2,(mutex_type *)SField_mutex);
  __end2 = std::
           map<int,_std::unique_ptr<const_jbcoin::SField,_std::default_delete<const_jbcoin::SField>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::unique_ptr<const_jbcoin::SField,_std::default_delete<const_jbcoin::SField>_>_>_>_>
           ::begin((map<int,_std::unique_ptr<const_jbcoin::SField,_std::default_delete<const_jbcoin::SField>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::unique_ptr<const_jbcoin::SField,_std::default_delete<const_jbcoin::SField>_>_>_>_>
                    *)unknownCodeToField);
  fieldPair_1 = (pair<const_int,_std::unique_ptr<const_jbcoin::SField,_std::default_delete<const_jbcoin::SField>_>_>
                 *)std::
                   map<int,_std::unique_ptr<const_jbcoin::SField,_std::default_delete<const_jbcoin::SField>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::unique_ptr<const_jbcoin::SField,_std::default_delete<const_jbcoin::SField>_>_>_>_>
                   ::end((map<int,_std::unique_ptr<const_jbcoin::SField,_std::default_delete<const_jbcoin::SField>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::unique_ptr<const_jbcoin::SField,_std::default_delete<const_jbcoin::SField>_>_>_>_>
                          *)unknownCodeToField);
  do {
    bVar1 = std::operator!=(&__end2,(_Self *)&fieldPair_1);
    if (!bVar1) {
      bVar1 = false;
LAB_002f2130:
      std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)&__range2);
      if (!bVar1) {
        fieldName_local = (string *)sfInvalid;
      }
      return (SField *)fieldName_local;
    }
    ppVar3 = std::
             _Rb_tree_iterator<std::pair<const_int,_std::unique_ptr<const_jbcoin::SField,_std::default_delete<const_jbcoin::SField>_>_>_>
             ::operator*(&__end2);
    pSVar4 = std::unique_ptr<const_jbcoin::SField,_std::default_delete<const_jbcoin::SField>_>::
             operator->(&ppVar3->second);
    _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &pSVar4->fieldName,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            fieldName);
    if (_Var2) {
      fieldName_local =
           (string *)
           std::unique_ptr<const_jbcoin::SField,_std::default_delete<const_jbcoin::SField>_>::
           operator*(&ppVar3->second);
      bVar1 = true;
      goto LAB_002f2130;
    }
    std::
    _Rb_tree_iterator<std::pair<const_int,_std::unique_ptr<const_jbcoin::SField,_std::default_delete<const_jbcoin::SField>_>_>_>
    ::operator++(&__end2);
  } while( true );
}

Assistant:

SField const&
SField::getField (std::string const& fieldName)
{
    for (auto const & fieldPair : knownCodeToField)
    {
        if (fieldPair.second->fieldName == fieldName)
            return * (fieldPair.second);
    }
    {
        StaticScopedLockType sl (SField_mutex);

        for (auto const & fieldPair : unknownCodeToField)
        {
            if (fieldPair.second->fieldName == fieldName)
                return * (fieldPair.second);
        }
    }
    return sfInvalid;
}